

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  bool bVar1;
  ImDrawChannel *pIVar2;
  int iVar3;
  float fVar4;
  int iVar5;
  ImDrawChannel *pIVar6;
  ImDrawCmd *local_40;
  ImDrawCmd *curr_cmd;
  int idx_local;
  ImDrawList *draw_list_local;
  ImDrawListSplitter *this_local;
  
  bVar1 = false;
  if (-1 < idx) {
    bVar1 = idx < this->_Count;
  }
  if (bVar1) {
    if (this->_Current != idx) {
      pIVar6 = (this->_Channels).Data + this->_Current;
      iVar5 = (draw_list->CmdBuffer).Capacity;
      (pIVar6->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
      (pIVar6->_CmdBuffer).Capacity = iVar5;
      (pIVar6->_CmdBuffer).Data = (draw_list->CmdBuffer).Data;
      pIVar6 = (this->_Channels).Data;
      iVar5 = this->_Current;
      iVar3 = (draw_list->IdxBuffer).Capacity;
      pIVar2 = pIVar6 + iVar5;
      (pIVar2->_IdxBuffer).Size = (draw_list->IdxBuffer).Size;
      (pIVar2->_IdxBuffer).Capacity = iVar3;
      pIVar6[iVar5]._IdxBuffer.Data = (draw_list->IdxBuffer).Data;
      this->_Current = idx;
      pIVar6 = (this->_Channels).Data + idx;
      iVar5 = (pIVar6->_CmdBuffer).Capacity;
      (draw_list->CmdBuffer).Size = (pIVar6->_CmdBuffer).Size;
      (draw_list->CmdBuffer).Capacity = iVar5;
      (draw_list->CmdBuffer).Data = (pIVar6->_CmdBuffer).Data;
      pIVar6 = (this->_Channels).Data;
      pIVar2 = pIVar6 + idx;
      iVar5 = (pIVar2->_IdxBuffer).Capacity;
      (draw_list->IdxBuffer).Size = (pIVar2->_IdxBuffer).Size;
      (draw_list->IdxBuffer).Capacity = iVar5;
      (draw_list->IdxBuffer).Data = pIVar6[idx]._IdxBuffer.Data;
      draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
      if ((draw_list->CmdBuffer).Size == 0) {
        local_40 = (ImDrawCmd *)0x0;
      }
      else {
        local_40 = (draw_list->CmdBuffer).Data + ((draw_list->CmdBuffer).Size + -1);
      }
      if (local_40 == (ImDrawCmd *)0x0) {
        ImDrawList::AddDrawCmd(draw_list);
      }
      else if (local_40->ElemCount == 0) {
        fVar4 = (draw_list->_CmdHeader).ClipRect.y;
        (local_40->ClipRect).x = (draw_list->_CmdHeader).ClipRect.x;
        (local_40->ClipRect).y = fVar4;
        fVar4 = (draw_list->_CmdHeader).ClipRect.w;
        (local_40->ClipRect).z = (draw_list->_CmdHeader).ClipRect.z;
        (local_40->ClipRect).w = fVar4;
        local_40->TextureId = (draw_list->_CmdHeader).TextureId;
        local_40->VtxOffset = (draw_list->_CmdHeader).VtxOffset;
      }
      else {
        iVar5 = memcmp(local_40,&draw_list->_CmdHeader,0x1c);
        if (iVar5 != 0) {
          ImDrawList::AddDrawCmd(draw_list);
        }
      }
    }
    return;
  }
  __assert_fail("idx >= 0 && idx < _Count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_draw.cpp"
                ,0x701,"void ImDrawListSplitter::SetCurrentChannel(ImDrawList *, int)");
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = (draw_list->CmdBuffer.Size == 0) ? NULL : &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd == NULL)
        draw_list->AddDrawCmd();
    else if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}